

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallLeafHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::SmallLeafHeapBlockT
          (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *this,
          HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *bucket,
          ushort objectSize,ushort objectCount)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined6 in_register_0000000a;
  undefined8 *in_FS_OFFSET;
  
  SmallHeapBlockT<MediumAllocationBlockAttributes>::SmallHeapBlockT
            (&this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>,&bucket->super_HeapBucket
             ,objectSize,objectCount,MediumLeafBlockType);
  (this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).super_HeapBlock._vptr_HeapBlock =
       (_func_int **)&PTR_WBSetBit_0035b550;
  if ((1 < objectCount) &&
     (uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetPageCount
                        (&this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>),
     (uVar4 << 0xc) / (uint)objectSize == (uint)CONCAT62(in_register_0000000a,objectCount))) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  *puVar1 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallLeafHeapBlock.cpp"
                     ,0x20,
                     "(objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize) / objectSize)"
                     ,
                     "objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize) / objectSize"
                    );
  if (bVar3) {
    *puVar1 = 0;
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::SmallLeafHeapBlockT(HeapBucketT<SmallLeafHeapBlockT<MediumAllocationBlockAttributes>> * bucket, ushort objectSize, ushort objectCount)
    : Base(bucket, objectSize, objectCount, HeapBlock::HeapBlockType::MediumLeafBlockType)
{
    Assert(objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize) / objectSize);
}